

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ContentSpecNode::serialize(ContentSpecNode *this,XSerializeEngine *serEng)

{
  XMLElementDecl *pXVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int type;
  NodeTypes local_1c;
  
  if (serEng->fStoreLoad != 0) {
    xercesc_4_0::operator>>(serEng,&this->fElement);
    pXVar1 = XMLElementDecl::loadElementDecl(serEng);
    this->fElementDecl = pXVar1;
    xercesc_4_0::operator>>(serEng,&this->fFirst);
    xercesc_4_0::operator>>(serEng,&this->fSecond);
    XSerializeEngine::operator>>(serEng,&local_1c);
    this->fType = local_1c;
    XSerializeEngine::operator>>(serEng,&this->fAdoptFirst);
    XSerializeEngine::operator>>(serEng,&this->fAdoptSecond);
    XSerializeEngine::operator>>(serEng,&this->fMinOccurs);
    XSerializeEngine::operator>>(serEng,&this->fMaxOccurs);
    return;
  }
  XSerializeEngine::write(serEng,(int)this->fElement,in_RDX,in_RCX);
  XMLElementDecl::storeElementDecl(serEng,this->fElementDecl);
  XSerializeEngine::write(serEng,(int)this->fFirst,__buf,in_RCX);
  XSerializeEngine::write(serEng,(int)this->fSecond,__buf_00,in_RCX);
  XSerializeEngine::operator<<(serEng,this->fType);
  XSerializeEngine::operator<<(serEng,this->fAdoptFirst);
  XSerializeEngine::operator<<(serEng,this->fAdoptSecond);
  XSerializeEngine::operator<<(serEng,this->fMinOccurs);
  XSerializeEngine::operator<<(serEng,this->fMaxOccurs);
  return;
}

Assistant:

void ContentSpecNode::serialize(XSerializeEngine& serEng)
{
    /***
     *  Since fElement, fFirst, fSecond are NOT created by the default 
     *  constructor, we need to create them dynamically.
     ***/

    if (serEng.isStoring())
    {
        serEng<<fElement;
        XMLElementDecl::storeElementDecl(serEng, fElementDecl);
        serEng<<fFirst;
        serEng<<fSecond;

        serEng<<(int)fType;
        serEng<<fAdoptFirst;
        serEng<<fAdoptSecond;
        serEng<<fMinOccurs;
        serEng<<fMaxOccurs;
    }
    else
    {
        serEng>>fElement;
        fElementDecl = XMLElementDecl::loadElementDecl(serEng);
        serEng>>fFirst;
        serEng>>fSecond;

        int type;
        serEng>>type;
        fType = (NodeTypes)type;

        serEng>>fAdoptFirst;
        serEng>>fAdoptSecond;
        serEng>>fMinOccurs;
        serEng>>fMaxOccurs;
    }

}